

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdsNODE::gdsNODE(gdsNODE *this)

{
  allocator<char> local_11;
  gdsNODE *local_10;
  gdsNODE *this_local;
  
  this->plex = 0;
  this->layer = 0;
  this->nodetype = 0;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->xCor);
  std::vector<int,_std::allocator<int>_>::vector(&this->yCor);
  this->propattr = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->propvalue,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  return;
}

Assistant:

gdsNODE(){}